

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macro_function.cpp
# Opt level: O2

MacroBindResult *
duckdb::MacroFunction::BindMacroFunction
          (MacroBindResult *__return_storage_ptr__,
          vector<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_true>
          *functions,string *name,FunctionExpression *function_expr,
          vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
          *positionals,
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
          *defaults)

{
  __uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_> *p_Var1;
  pointer puVar2;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var3;
  undefined8 uVar4;
  pointer pPVar5;
  size_type sVar6;
  __uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_> *this;
  const_reference pvVar7;
  pointer pMVar8;
  idx_t __n;
  type pMVar9;
  iterator iVar10;
  mapped_type *pmVar11;
  ulong __n_00;
  __uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_> *__u;
  string *psVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1;
  __node_base *p_Var13;
  long lVar14;
  unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true> *function;
  pointer this_00;
  __node_base *p_Var15;
  string error;
  optional_idx result_idx;
  allocator local_289;
  MacroBindResult *local_288;
  undefined1 local_280 [32];
  string *local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  optional_idx local_238;
  string local_230;
  string local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  string local_1d0;
  string local_1b0 [32];
  string local_190;
  string local_170;
  string local_150 [32];
  string local_130;
  string local_110;
  string local_f0;
  string local_d0 [32];
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  p_Var1 = (__uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
            *)(function_expr->children).
              super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  params_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)positionals;
  local_288 = __return_storage_ptr__;
  local_260 = name;
  for (__u = (__uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
              *)(function_expr->children).
                super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start; __u != p_Var1; __u = __u + 1) {
    pPVar5 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                           *)__u);
    if ((pPVar5->super_BaseExpression).alias._M_string_length == 0) {
      if ((defaults->_M_h)._M_element_count != 0) {
        ::std::__cxx11::string::string
                  ((string *)&local_b0,
                   "Positional parameters cannot come after parameters with a default value!",
                   (allocator *)local_280);
        MacroBindResult::MacroBindResult(local_288,&local_b0);
        psVar12 = &local_b0;
        goto LAB_015e730b;
      }
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                  *)positionals,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)__u);
    }
    else {
      pPVar5 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                             *)__u);
      sVar6 = ::std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::count(&defaults->_M_h,&(pPVar5->super_BaseExpression).alias);
      if (sVar6 != 0) {
        ::std::__cxx11::string::string
                  ((string *)&local_70,"Duplicate default parameters %s!",(allocator *)local_280);
        pPVar5 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                               *)__u);
        ::std::__cxx11::string::string
                  ((string *)&local_90,(string *)&(pPVar5->super_BaseExpression).alias);
        StringUtil::Format<std::__cxx11::string>
                  (&local_50,(StringUtil *)&local_70,&local_90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   function_expr);
        MacroBindResult::MacroBindResult(local_288,&local_50);
        ::std::__cxx11::string::~string((string *)&local_50);
        ::std::__cxx11::string::~string((string *)&local_90);
        psVar12 = &local_70;
        goto LAB_015e730b;
      }
      pPVar5 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                             *)__u);
      this = (__uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
              *)::std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)defaults,&(pPVar5->super_BaseExpression).alias);
      ::std::
      __uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>::
      operator=(this,__u);
    }
  }
  local_238.index = 0xffffffffffffffff;
  __n_00 = 0;
  do {
    if ((ulong)((long)(functions->
                      super_vector<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>_>_>
                      ).
                      super__Vector_base<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(functions->
                      super_vector<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>_>_>
                      ).
                      super__Vector_base<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) <= __n_00) {
LAB_015e6faa:
      local_280._0_8_ = local_280 + 0x10;
      local_280._8_8_ = 0;
      local_280[0x10] = '\0';
      if ((long)(functions->
                super_vector<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>_>_>
                ).
                super__Vector_base<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(functions->
                super_vector<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>_>_>
                ).
                super__Vector_base<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start == 8) {
        pvVar7 = vector<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_true>
                 ::get<true>(functions,0);
        pMVar9 = unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>
                 ::operator*(pvVar7);
        ::std::__cxx11::string::string
                  (local_d0,"Macro function %s requires ",(allocator *)&local_230);
        FormatMacroFunction(&local_f0,pMVar9,local_260);
        StringUtil::Format<std::__cxx11::string>
                  (&local_258,(StringUtil *)local_d0,&local_f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   function_expr);
        ::std::__cxx11::string::operator=((string *)local_280,(string *)&local_258);
        ::std::__cxx11::string::~string((string *)&local_258);
        ::std::__cxx11::string::~string((string *)&local_f0);
        ::std::__cxx11::string::~string(local_d0);
        lVar14 = (long)(pMVar9->parameters).
                       super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                       .
                       super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(pMVar9->parameters).
                       super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                       .
                       super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        if (lVar14 == 8) {
          ::std::__cxx11::string::string
                    ((string *)&local_258,"a single positional argument",(allocator *)&local_230);
        }
        else {
          ::std::__cxx11::string::string
                    ((string *)&local_110,"%i positional arguments",(allocator *)&local_230);
          Exception::ConstructMessage<unsigned_long>
                    (&local_258,&local_110,
                     (long)(pMVar9->parameters).
                           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                           .
                           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pMVar9->parameters).
                           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                           .
                           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3);
        }
        ::std::__cxx11::string::append((string *)local_280);
        ::std::__cxx11::string::~string((string *)&local_258);
        if (lVar14 != 8) {
          ::std::__cxx11::string::~string((string *)&local_110);
        }
        ::std::__cxx11::string::append(local_280);
        lVar14 = (long)(positionals->
                       super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                       ).
                       super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(positionals->
                       super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                       ).
                       super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        if (lVar14 == 8) {
          ::std::__cxx11::string::string
                    ((string *)&local_258,"a single positional argument was",&local_289);
        }
        else {
          ::std::__cxx11::string::string
                    ((string *)&local_130,"%i positional arguments were",&local_289);
          Exception::ConstructMessage<unsigned_long>
                    (&local_258,&local_130,
                     (long)(positionals->
                           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                           ).
                           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(positionals->
                           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                           ).
                           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3);
        }
        ::std::__cxx11::string::append((string *)local_280);
        ::std::__cxx11::string::~string((string *)&local_258);
        if (lVar14 != 8) {
          ::std::__cxx11::string::~string((string *)&local_130);
        }
        ::std::__cxx11::string::append(local_280);
      }
      else {
        ::std::__cxx11::string::string
                  (local_150,"Macro \"%s\" does not support %llu parameters.\n",
                   (allocator *)&local_230);
        ::std::__cxx11::string::string((string *)&local_170,(string *)local_260);
        StringUtil::Format<std::__cxx11::string,unsigned_long>
                  (&local_258,(StringUtil *)local_150,&local_170,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)(positionals->
                          super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                          ).
                          super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(positionals->
                          super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                          ).
                          super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3),(unsigned_long)params_1);
        ::std::__cxx11::string::append((string *)local_280);
        ::std::__cxx11::string::~string((string *)&local_258);
        ::std::__cxx11::string::~string((string *)&local_170);
        ::std::__cxx11::string::~string(local_150);
        ::std::__cxx11::string::append(local_280);
        puVar2 = (functions->
                 super_vector<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>_>_>
                 ).
                 super__Vector_base<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (this_00 = (functions->
                       super_vector<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>_>_>
                       ).
                       super__Vector_base<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; this_00 != puVar2;
            this_00 = this_00 + 1) {
          pMVar9 = unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>
                   ::operator*(this_00);
          FormatMacroFunction(&local_230,pMVar9,local_260);
          ::std::operator+(&local_258,"\n\t",&local_230);
          ::std::__cxx11::string::append((string *)local_280);
          ::std::__cxx11::string::~string((string *)&local_258);
          ::std::__cxx11::string::~string((string *)&local_230);
        }
      }
      ::std::__cxx11::string::string((string *)&local_190,(string *)local_280);
      MacroBindResult::MacroBindResult(local_288,&local_190);
      psVar12 = &local_190;
LAB_015e7301:
      ::std::__cxx11::string::~string((string *)psVar12);
      psVar12 = (string *)local_280;
LAB_015e730b:
      ::std::__cxx11::string::~string((string *)psVar12);
      return local_288;
    }
    pvVar7 = vector<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_true>
             ::get<true>(functions,__n_00);
    pMVar8 = unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>::
             operator->(pvVar7);
    function_expr =
         (FunctionExpression *)
         ((long)(pMVar8->parameters).
                super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
         (long)(pMVar8->parameters).
               super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    if (function_expr ==
        (FunctionExpression *)
        ((long)(positionals->
               super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               ).
               super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
        (long)(positionals->
              super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              ).
              super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start)) {
      optional_idx::optional_idx((optional_idx *)local_280,__n_00);
      local_238.index = local_280._0_8_;
      if ((ParsedExpression *)local_280._0_8_ != (ParsedExpression *)0xffffffffffffffff) {
        __n = optional_idx::GetIndex(&local_238);
        pvVar7 = vector<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_true>
                 ::get<true>(functions,__n);
        pMVar9 = unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>
                 ::operator*(pvVar7);
        p_Var13 = &(defaults->_M_h)._M_before_begin;
        do {
          p_Var13 = p_Var13->_M_nxt;
          if (p_Var13 == (__node_base *)0x0) {
            p_Var15 = &(pMVar9->default_parameters)._M_h._M_before_begin;
            while (p_Var15 = p_Var15->_M_nxt, p_Var15 != (__node_base *)0x0) {
              sVar6 = ::std::
                      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      ::count(&defaults->_M_h,(key_type *)(p_Var15 + 1));
              if (sVar6 == 0) {
                pPVar5 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                         ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                       *)(p_Var15 + 5));
                (*(pPVar5->super_BaseExpression)._vptr_BaseExpression[0xc])(local_280,pPVar5);
                pmVar11 = ::std::__detail::
                          _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                        *)defaults,(key_type *)(p_Var15 + 1));
                uVar4 = local_280._0_8_;
                local_280._0_8_ = (ParsedExpression *)0x0;
                _Var3._M_head_impl =
                     (pmVar11->
                     super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                     )._M_t.
                     super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                     .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
                (pmVar11->
                super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                )._M_t.
                super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
                     (ParsedExpression *)uVar4;
                if (_Var3._M_head_impl != (ParsedExpression *)0x0) {
                  (**(code **)(*(long *)&(_Var3._M_head_impl)->super_BaseExpression + 8))();
                }
                if ((ParsedExpression *)local_280._0_8_ != (ParsedExpression *)0x0) {
                  (**(code **)(*(long *)local_280._0_8_ + 8))();
                }
              }
            }
            MacroBindResult::MacroBindResult(local_288,__n);
            return local_288;
          }
          iVar10 = ::std::
                   _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(&(pMVar9->default_parameters)._M_h,(key_type *)(p_Var13 + 1));
        } while (iVar10.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>,_true>
                 ._M_cur != (__node_type *)0x0);
        ::std::__cxx11::string::string
                  (local_1b0,"Macro \"%s\" does not have a named parameter \"%s\"\n",
                   (allocator *)&local_258);
        ::std::__cxx11::string::string((string *)&local_1d0,(string *)local_260);
        ::std::__cxx11::string::string((string *)&local_1f0,(string *)(p_Var13 + 1));
        StringUtil::Format<std::__cxx11::string,std::__cxx11::string>
                  ((string *)local_280,(StringUtil *)local_1b0,&local_1d0,&local_1f0,params_1);
        ::std::__cxx11::string::~string((string *)&local_1f0);
        ::std::__cxx11::string::~string((string *)&local_1d0);
        ::std::__cxx11::string::~string(local_1b0);
        FormatMacroFunction(&local_230,pMVar9,local_260);
        ::std::operator+(&local_258,"\nMacro definition: ",&local_230);
        ::std::__cxx11::string::append((string *)local_280);
        ::std::__cxx11::string::~string((string *)&local_258);
        ::std::__cxx11::string::~string((string *)&local_230);
        ::std::__cxx11::string::string((string *)&local_210,(string *)local_280);
        MacroBindResult::MacroBindResult(local_288,&local_210);
        psVar12 = &local_210;
        goto LAB_015e7301;
      }
      goto LAB_015e6faa;
    }
    __n_00 = __n_00 + 1;
  } while( true );
}

Assistant:

MacroBindResult MacroFunction::BindMacroFunction(const vector<unique_ptr<MacroFunction>> &functions, const string &name,
                                                 FunctionExpression &function_expr,
                                                 vector<unique_ptr<ParsedExpression>> &positionals,
                                                 unordered_map<string, unique_ptr<ParsedExpression>> &defaults) {
	// separate positional and default arguments
	for (auto &arg : function_expr.children) {
		if (!arg->GetAlias().empty()) {
			// default argument
			if (defaults.count(arg->GetAlias())) {
				return MacroBindResult(StringUtil::Format("Duplicate default parameters %s!", arg->GetAlias()));
			}
			defaults[arg->GetAlias()] = std::move(arg);
		} else if (!defaults.empty()) {
			return MacroBindResult("Positional parameters cannot come after parameters with a default value!");
		} else {
			// positional argument
			positionals.push_back(std::move(arg));
		}
	}

	// check for each macro function if it matches the number of positional arguments
	optional_idx result_idx;
	for (idx_t function_idx = 0; function_idx < functions.size(); function_idx++) {
		if (functions[function_idx]->parameters.size() == positionals.size()) {
			// found a matching function
			result_idx = function_idx;
			break;
		}
	}
	if (!result_idx.IsValid()) {
		// no matching function found
		string error;
		if (functions.size() == 1) {
			// we only have one function - print the old more detailed error message
			auto &macro_def = *functions[0];
			auto &parameters = macro_def.parameters;
			error = StringUtil::Format("Macro function %s requires ", FormatMacroFunction(macro_def, name));
			error += parameters.size() == 1 ? "a single positional argument"
			                                : StringUtil::Format("%i positional arguments", parameters.size());
			error += ", but ";
			error += positionals.size() == 1 ? "a single positional argument was"
			                                 : StringUtil::Format("%i positional arguments were", positionals.size());
			error += " provided.";
		} else {
			// we have multiple functions - list all candidates
			error += StringUtil::Format("Macro \"%s\" does not support %llu parameters.\n", name, positionals.size());
			error += "Candidate macros:";
			for (auto &function : functions) {
				error += "\n\t" + FormatMacroFunction(*function, name);
			}
		}
		return MacroBindResult(error);
	}
	// found a matching index - check if the default values exist within the macro
	auto macro_idx = result_idx.GetIndex();
	auto &macro_def = *functions[macro_idx];
	for (auto &default_val : defaults) {
		auto entry = macro_def.default_parameters.find(default_val.first);
		if (entry == macro_def.default_parameters.end()) {
			string error =
			    StringUtil::Format("Macro \"%s\" does not have a named parameter \"%s\"\n", name, default_val.first);
			error += "\nMacro definition: " + FormatMacroFunction(macro_def, name);
			return MacroBindResult(error);
		}
	}
	// Add the default values for parameters that have defaults, that were not explicitly assigned to
	for (auto it = macro_def.default_parameters.begin(); it != macro_def.default_parameters.end(); it++) {
		auto &parameter_name = it->first;
		auto &parameter_default = it->second;
		if (!defaults.count(parameter_name)) {
			// This parameter was not set yet, set it with the default value
			defaults[parameter_name] = parameter_default->Copy();
		}
	}
	return MacroBindResult(macro_idx);
}